

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

ByteArray *
ot::commissioner::Commissioner::ComputeJoinerId(ByteArray *__return_storage_ptr__,uint64_t aEui64)

{
  reference aBuf;
  size_type sVar1;
  byte *pbVar2;
  allocator<unsigned_char> local_ce;
  undefined1 local_cd;
  undefined1 local_c0 [8];
  ByteArray eui64;
  uint8_t hash [32];
  Sha256 sha256;
  uint64_t aEui64_local;
  ByteArray *joinerId;
  
  Sha256::Sha256((Sha256 *)(hash + 0x1c));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  utils::Encode<unsigned_long>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,aEui64);
  Sha256::Start((Sha256 *)(hash + 0x1c));
  aBuf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,0);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  Sha256::Update((Sha256 *)(hash + 0x1c),aBuf,(uint16_t)sVar1);
  Sha256::Finish((Sha256 *)(hash + 0x1c),
                 (uint8_t *)
                 &eui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  local_cd = 0;
  std::allocator<unsigned_char>::allocator(&local_ce);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (uchar *)&eui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,hash,&local_ce);
  std::allocator<unsigned_char>::~allocator(&local_ce);
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,0);
  *pbVar2 = *pbVar2 | 2;
  local_cd = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  Sha256::~Sha256((Sha256 *)(hash + 0x1c));
  return __return_storage_ptr__;
}

Assistant:

ByteArray Commissioner::ComputeJoinerId(uint64_t aEui64)
{
    Sha256    sha256;
    uint8_t   hash[Sha256::kHashSize];
    ByteArray eui64;

    utils::Encode(eui64, aEui64);

    sha256.Start();
    sha256.Update(&eui64[0], eui64.size());
    sha256.Finish(hash);

    static_assert(sizeof(hash) >= kJoinerIdLength, "wrong crypto::Sha256::kHashSize value");

    ByteArray joinerId{hash, hash + kJoinerIdLength};
    joinerId[0] |= kLocalExternalAddrMask;
    return joinerId;
}